

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O2

void __thiscall FIX::Initiator::start(Initiator *this)

{
  SessionSettings *s;
  bool bVar1;
  RuntimeError *this_00;
  allocator<char> local_39;
  string local_38;
  
  this->m_stop = false;
  s = &this->m_settings;
  (*this->_vptr_Initiator[2])(this,s);
  (*this->_vptr_Initiator[3])(this,s);
  HttpServer::startGlobal(s);
  bVar1 = thread_spawn(startThread,this,&this->m_threadid);
  if (bVar1) {
    return;
  }
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Unable to spawn thread",&local_39);
  RuntimeError::RuntimeError(this_00,&local_38);
  __cxa_throw(this_00,&RuntimeError::typeinfo,Exception::~Exception);
}

Assistant:

void Initiator::start() EXCEPT ( ConfigError, RuntimeError )
{
  m_stop = false;
  onConfigure( m_settings );
  onInitialize( m_settings );

  HttpServer::startGlobal( m_settings );

  if( !thread_spawn( &startThread, this, m_threadid ) )
    throw RuntimeError("Unable to spawn thread");
}